

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_iq2_xxs(block_iq2_xxs *x,float *y,int64_t k)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar4;
  int j;
  uint8_t signs;
  uint8_t *grid;
  int l;
  float db;
  int ib32;
  float d;
  int i;
  uint8_t *aux8;
  uint32_t aux32 [2];
  int64_t nb;
  float local_5c;
  int local_58;
  int local_44;
  int local_3c;
  int local_34;
  undefined8 local_28;
  long local_20;
  long local_10;
  long local_8;
  
  local_20 = in_RDX / 0x100;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_34 = 0; local_34 < local_20; local_34 = local_34 + 1) {
    fVar4 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_8 + (long)local_34 * 0x42));
    for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
      uVar3 = *(undefined8 *)(local_8 + (long)local_34 * 0x42 + 2 + (long)(local_3c << 2) * 2);
      local_28._4_4_ = (uint)((ulong)uVar3 >> 0x20);
      for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
        bVar1 = *(byte *)((long)&local_28 + (long)local_44);
        bVar2 = ""[local_28._4_4_ >> ((char)local_44 * '\a' & 0x1fU) & 0x7f];
        for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
          local_5c = -1.0;
          if ((bVar2 & kmask_iq2xs[local_58]) == 0) {
            local_5c = 1.0;
          }
          *(float *)(local_10 + (long)local_58 * 4) =
               fVar4 * ((float)(local_28._4_4_ >> 0x1c) + 0.5) * 0.25 *
               (float)*(byte *)((long)iq2xxs_grid + (long)local_58 + (long)(int)(uint)bVar1 * 8) *
               local_5c;
        }
        local_10 = local_10 + 0x20;
      }
      local_28 = uVar3;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq2_xxs(const block_iq2_xxs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint32_t aux32[2];
    const uint8_t * aux8 = (const uint8_t *)aux32;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            memcpy(aux32, x[i].qs + 4*ib32, 2*sizeof(uint32_t));
            const float db = d * (0.5f + (aux32[1] >> 28)) * 0.25f;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2xxs_grid + aux8[l]);
                const uint8_t  signs = ksigns_iq2xs[(aux32[1] >> 7*l) & 127];
                for (int j = 0; j < 8; ++j) {
                    y[j] = db * grid[j] * (signs & kmask_iq2xs[j] ? -1.f : 1.f);
                }
                y += 8;
            }
        }
    }
}